

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

bool __thiscall cmCTestSVN::InfoParser::ProcessLine(InfoParser *this)

{
  bool bVar1;
  string local_70;
  string local_50;
  string local_30;
  InfoParser *local_10;
  InfoParser *this_local;
  
  local_10 = this;
  bVar1 = cmsys::RegularExpression::find(&this->RegexRev,&(this->super_LineParser).Line);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_(&local_30,&this->RegexRev,1);
    std::__cxx11::string::operator=((string *)this->Rev,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    bVar1 = cmsys::RegularExpression::find(&this->RegexURL,&(this->super_LineParser).Line);
    if (bVar1) {
      cmsys::RegularExpression::match_abi_cxx11_(&local_50,&this->RegexURL,1);
      std::__cxx11::string::operator=((string *)&this->SVNRepo->URL,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      bVar1 = cmsys::RegularExpression::find(&this->RegexRoot,&(this->super_LineParser).Line);
      if (bVar1) {
        cmsys::RegularExpression::match_abi_cxx11_(&local_70,&this->RegexRoot,1);
        std::__cxx11::string::operator=((string *)&this->SVNRepo->Root,(string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
  }
  return true;
}

Assistant:

virtual bool ProcessLine()
    {
    if(this->RegexRev.find(this->Line))
      {
      this->Rev = this->RegexRev.match(1);
      }
    else if(this->RegexURL.find(this->Line))
      {
      this->SVNRepo.URL = this->RegexURL.match(1);
      }
    else if(this->RegexRoot.find(this->Line))
      {
      this->SVNRepo.Root = this->RegexRoot.match(1);
      }
    return true;
    }